

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O1

size_t ans_sint_compress<5u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t i;
  long lVar7;
  long lVar8;
  uint8_t *puVar9;
  ans_sint_encode<5U> ans_frame;
  uint8_t *local_c0;
  uint32_t *local_b8;
  ulong local_b0 [4];
  uint8_t *local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  ans_sint_encode<5U> local_70;
  
  local_b8 = src;
  ans_sint_encode<5U>::create(&local_70,src,srcSize);
  local_c0 = dst;
  ans_serialize_interp(&local_70.nfreqs,local_70.frame_size,&local_c0);
  local_b0[1] = local_70.lower_bound;
  local_b0[2] = local_70.lower_bound;
  local_b0[3] = local_70.lower_bound;
  local_b0[0] = local_70.lower_bound;
  if ((srcSize & 3) == 0) {
    lVar8 = 0;
    puVar9 = local_c0;
  }
  else {
    lVar8 = 0;
    do {
      uVar1 = local_b8[srcSize + lVar8 + -1];
      if (local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl
          .super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b0[0]) {
        *(int *)local_c0 = (int)local_b0[0];
        local_c0 = local_c0 + 4;
        local_b0[0] = local_b0[0] >> 0x20;
      }
      uVar2 = local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      local_b0[0] = (ulong)local_70.table.
                           super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar1].base +
                    local_b0[0] % (ulong)uVar2 + (local_b0[0] / uVar2) * local_70.frame_size;
      lVar8 = lVar8 + -1;
    } while (-lVar8 != (ulong)((uint)srcSize & 3));
    lVar8 = -lVar8;
    puVar9 = local_c0;
  }
  lVar8 = srcSize - lVar8;
  if (lVar8 != 0) {
    local_88 = local_70.frame_size;
    do {
      uVar1 = local_b8[lVar8 + -1];
      if (local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl
          .super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b0[0]) {
        *(int *)puVar9 = (int)local_b0[0];
        puVar9 = puVar9 + 4;
        local_b0[0] = local_b0[0] >> 0x20;
      }
      uVar2 = local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      local_78 = (ulong)local_70.table.
                        super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1].base;
      uVar1 = local_b8[lVar8 + -2];
      if (local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl
          .super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b0[1]) {
        *(int *)puVar9 = (int)local_b0[1];
        puVar9 = puVar9 + 4;
        local_b0[1] = local_b0[1] >> 0x20;
      }
      uVar3 = local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      local_80 = (ulong)local_70.table.
                        super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar1].base;
      uVar1 = local_b8[lVar8 + -3];
      if (local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl
          .super__Vector_impl_data._M_start[uVar1].sym_upper_bound <= local_b0[2]) {
        *(int *)puVar9 = (int)local_b0[2];
        puVar9 = puVar9 + 4;
        local_b0[2] = local_b0[2] >> 0x20;
      }
      uVar4 = local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].freq;
      uVar1 = local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar1].base;
      uVar5 = local_b8[lVar8 + -4];
      if (local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl
          .super__Vector_impl_data._M_start[uVar5].sym_upper_bound <= local_b0[3]) {
        *(int *)puVar9 = (int)local_b0[3];
        puVar9 = puVar9 + 4;
        local_b0[3] = local_b0[3] >> 0x20;
      }
      uVar6 = local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5].freq;
      local_b0[0] = local_b0[0] % (ulong)uVar2 + local_78 +
                    (local_b0[0] / uVar2) * local_70.frame_size;
      local_b0[1] = local_b0[1] % (ulong)uVar3 + local_80 +
                    (local_b0[1] / uVar3) * local_70.frame_size;
      local_b0[2] = local_b0[2] % (ulong)uVar4 + (ulong)uVar1 +
                    (local_b0[2] / uVar4) * local_70.frame_size;
      local_b0[3] = (ulong)local_70.table.
                           super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar5].base +
                    local_b0[3] % (ulong)uVar6 + (local_b0[3] / uVar6) * local_70.frame_size;
      lVar8 = lVar8 + -4;
    } while (lVar8 != 0);
    local_90 = dst;
  }
  lVar7 = 0;
  lVar8 = 0;
  do {
    *(ulong *)(puVar9 + lVar8 * 8) = local_b0[lVar8] - local_70.lower_bound;
    lVar8 = lVar8 + 1;
    lVar7 = lVar7 + -8;
  } while (lVar8 != 4);
  local_c0 = puVar9;
  if (local_70.table.super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.table.
                    super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.table.
                          super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.table.
                          super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.nfreqs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.nfreqs.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (size_t)(puVar9 + (-lVar7 - (long)dst));
}

Assistant:

size_t ans_sint_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    const uint32_t num_states = 4;
#ifdef RECORD_STATS
    auto start_compress = std::chrono::high_resolution_clock::now();
#endif

    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_sint_encode<H_approx>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    std::array<uint64_t, num_states> states;

    // start encoding
    for (uint32_t i = 0; i < num_states; i++)
        states[i] = ans_frame.initial_state();

#ifdef RECORD_STATS
    auto stop_prelude = std::chrono::high_resolution_clock::now();
    get_stats().prelude_bytes = out_u8 - reinterpret_cast<uint8_t*>(dst);
    get_stats().prelude_time_ns = (stop_prelude - start_compress).count();
#endif

    // std::cout << "encoding" << std::endl;
    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % num_states != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += num_states;
    }

    // flush final state
    for (uint32_t i = 0; i < num_states; i++)
        ans_frame.flush_state(states[i], out_u8);

#ifdef RECORD_STATS
    auto stop_compress = std::chrono::high_resolution_clock::now();
    get_stats().encode_bytes = (out_u8 - reinterpret_cast<uint8_t*>(dst))
        - get_stats().prelude_bytes;
    get_stats().encode_time_ns = (stop_compress - stop_prelude).count();
#endif

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}